

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<unsigned_int_const&,unsigned_int_const&,bool>
          (ObjectPool<spirv_cross::SPIRConstant> *this,uint *p,uint *p_1,bool *p_2)

{
  Vector<spirv_cross::SPIRConstant_*> *this_00;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  _Var1;
  _Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> _Var2;
  size_t sVar3;
  SPIRConstant *this_01;
  ulong uVar4;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
  if (sVar3 == 0) {
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
            .buffer_size;
    uVar4 = (ulong)(this->start_object_count << ((byte)sVar3 & 0x1f));
    _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>)malloc(uVar4 * 0x168);
    if (_Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl ==
        (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    if (uVar4 != 0) {
      sVar3 = 0;
      _Var2._M_head_impl =
           (SPIRConstant *)
           _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar3] =
             _Var2._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size = sVar3;
        _Var2._M_head_impl = _Var2._M_head_impl + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar3 + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> =
         _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_002cad5e;
  }
  else {
    this_01 = (this_00->super_VectorView<spirv_cross::SPIRConstant_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRConstant_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_002cad5e:
  SPIRConstant::SPIRConstant(this_01,(TypeID)*p,*p_1,*p_2);
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}